

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O2

cmFileLockResult __thiscall
cmFileLockPool::LockFunctionScope(cmFileLockPool *this,string *filename,unsigned_long timeoutSec)

{
  pointer pSVar1;
  bool bVar2;
  cmFileLockResult cVar3;
  
  bVar2 = IsAlreadyLocked(this,filename);
  if (bVar2) {
    cVar3 = cmFileLockResult::MakeAlreadyLocked();
    return cVar3;
  }
  pSVar1 = (this->FunctionScopes).
           super__Vector_base<cmFileLockPool::ScopePool,_std::allocator<cmFileLockPool::ScopePool>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->FunctionScopes).
      super__Vector_base<cmFileLockPool::ScopePool,_std::allocator<cmFileLockPool::ScopePool>_>.
      _M_impl.super__Vector_impl_data._M_start != pSVar1) {
    cVar3 = ScopePool::Lock(pSVar1 + -1,filename,timeoutSec);
    return cVar3;
  }
  cVar3 = cmFileLockResult::MakeNoFunction();
  return cVar3;
}

Assistant:

cmFileLockResult cmFileLockPool::LockFunctionScope(const std::string& filename,
                                                   unsigned long timeoutSec)
{
  if (this->IsAlreadyLocked(filename)) {
    return cmFileLockResult::MakeAlreadyLocked();
  }
  if (this->FunctionScopes.empty()) {
    return cmFileLockResult::MakeNoFunction();
  }
  return this->FunctionScopes.back().Lock(filename, timeoutSec);
}